

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O0

void handleTotalMassOptions(KinDynComputations *comp,parser *cmd)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  double dVar5;
  size_t l;
  Model *model;
  double totalMass;
  ulong local_60;
  allocator<char> *in_stack_ffffffffffffffb0;
  double dVar6;
  string *in_stack_ffffffffffffffb8;
  parser *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  bVar1 = cmdline::parser::exist(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    dVar6 = 0.0;
    lVar2 = iDynTree::KinDynComputations::getRobotModel();
    for (local_60 = 0; uVar3 = iDynTree::Model::getNrOfLinks(), local_60 < uVar3;
        local_60 = local_60 + 1) {
      iDynTree::Model::getLink(lVar2);
      iDynTree::Link::getInertia();
      dVar5 = (double)iDynTree::SpatialInertia::getMass();
      dVar6 = dVar5 + dVar6;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"The total mass of model is ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar6);
    poVar4 = std::operator<<(poVar4," Kg.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void handleTotalMassOptions(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    if( !cmd.exist("total-mass") )
    {
        return;
    }

    double totalMass = 0.0;

    const iDynTree::Model & model = comp.getRobotModel();

    for(size_t l=0; l < model.getNrOfLinks(); l++)
    {
        totalMass += model.getLink(l)->getInertia().getMass();
    }

    std::cout << "The total mass of model is "
                  << totalMass << " Kg." << std::endl;
}